

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::NullColumnReader::Plain
          (NullColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  TemplatedValidityMask<unsigned_long> *in_RCX;
  idx_t row_idx;
  ValidityMask *result_mask;
  idx_t in_stack_ffffffffffffffb8;
  TemplatedValidityMask<unsigned_long> *this_00;
  
  FlatVector::Validity((Vector *)0x22b8dcc);
  for (this_00 = (TemplatedValidityMask<unsigned_long> *)0x0; this_00 < in_RCX;
      this_00 = (TemplatedValidityMask<unsigned_long> *)((long)&this_00->validity_mask + 1)) {
    TemplatedValidityMask<unsigned_long>::SetInvalid(this_00,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void Plain(ByteBuffer &plain_data, uint8_t *defines, uint64_t num_values, idx_t result_offset,
	           Vector &result) override {
		(void)defines;
		(void)plain_data;

		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = 0; row_idx < num_values; row_idx++) {
			result_mask.SetInvalid(row_idx + result_offset);
		}
	}